

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O2

int zt_opt_process_args(int *argc,char **argv,zt_opt_def_t *args,zt_opt_validate validate,
                       zt_opt_error error)

{
  char cVar1;
  char cVar2;
  zt_opt_callback p_Var3;
  char *pcVar4;
  int iVar5;
  code *pcVar6;
  size_t sVar7;
  bool bVar8;
  int iVar9;
  size_t __n;
  char *pcVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  
  pcVar6 = _zt_opt_error_wrapper;
  if (error != (zt_opt_error)0x0) {
    pcVar6 = error;
  }
  if (validate == (zt_opt_validate)0x0) {
    validate = zt_opt_validate_default;
  }
  (*validate)(args,pcVar6);
  uVar11 = 1;
  do {
    if ((*argc <= (int)uVar11) || (pcVar10 = argv[uVar11], *pcVar10 != '-')) {
      *argc = uVar11;
      return 0;
    }
    cVar1 = pcVar10[1];
    bVar8 = true;
    if (cVar1 == '-') {
      pcVar10 = pcVar10 + 2;
      for (__n = 0; (cVar2 = pcVar10[__n], cVar2 != '\0' && (cVar2 != '=')); __n = __n + 1) {
      }
      bVar13 = cVar2 != '=';
    }
    else {
      pcVar10 = pcVar10 + 1;
      __n = 0;
      bVar13 = true;
    }
    do {
      uVar12 = 0;
      while( true ) {
        p_Var3 = args[uVar12].cb;
        if (p_Var3 == (zt_opt_callback)0x0) {
          if (bVar8) {
            (*pcVar6)(0x16,"\'%.*s\'",__n + (__n == 0),pcVar10);
          }
          goto LAB_00104837;
        }
        if ((((__n == 0) && (cVar2 = args[uVar12].sopt, cVar2 != -1)) && (*pcVar10 == cVar2)) ||
           (((pcVar4 = args[uVar12].lopt, pcVar4 != (char *)0x0 &&
             (sVar7 = strlen(pcVar4), sVar7 == __n)) &&
            (iVar5 = strncmp(pcVar10,pcVar4,__n), iVar5 == 0)))) break;
        uVar12 = (ulong)((int)uVar12 + 1);
      }
      iVar5 = (*p_Var3)(uVar11,(int)uVar12,argc,argv,args,pcVar6);
      if (iVar5 < 0) {
        return iVar5;
      }
      iVar9 = 0;
      if (bVar13) {
        iVar9 = iVar5;
      }
      uVar11 = uVar11 + iVar9;
      if ((cVar1 == '-') || (iVar5 != 0)) break;
      bVar8 = false;
      pcVar4 = pcVar10 + 1;
      pcVar10 = pcVar10 + 1;
    } while (*pcVar4 != '\0');
LAB_00104837:
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

int
zt_opt_process_args(int * argc, char ** argv, zt_opt_def_t * args, zt_opt_validate validate, zt_opt_error error) {
    int i;

    error    = error ? error : _zt_opt_error_wrapper;
    validate = validate ? validate : zt_opt_validate_default;

    validate(args, error);

    for (i = 1; i < *argc; i++) {
        if (argv[i][0] == '-') {
            unsigned int x;
            size_t       len          = 0;
            char       * p            = &argv[i][1];
            int          combined_opt = 0;
            int          found        = 0;
            int          long_opt     = 0;

            if (*p == '-') { /* long opt */
                long_opt = 1;
                ++p;
                for (len = 0; p[len] != '\0' && p[len] != '='; len++) {
                    ;
                }

                if (p[len] == '=') {
                    combined_opt = 1;
                }
            }


AGAIN:
            for (x = 0; args[x].cb; x++) {
                if ((len == 0 && args[x].sopt != ZT_OPT_NSO && *p == args[x].sopt) || /* short opt */
                    /* long opt */
                    (args[x].lopt != ZT_OPT_NLO && strlen(args[x].lopt) == len &&
                     strncmp(p, args[x].lopt, len) == 0)) {
                    int consumed = 0;

                    found = 1;
                    if ((consumed = args[x].cb(i, x, argc, argv, args, error)) < 0) {
                        /* error */
                        return consumed;
                    }

                    if (!combined_opt) {
                        i += consumed;
                    }

                    if(!consumed && !long_opt && *(++p)) {
                        /* if we did not consume extra args AND
                         * we are a short option AND
                         * there are more short options to consume
                         */
                        goto AGAIN;
                    }

                    break;
                }
            }

            if (!found) {
                error(EINVAL, "'%.*s'", len ? len : 1, p);
            }
        } else {
            break;
        }
    }

    *argc = i;

    return 0;
}